

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall
Potassco::ProgramOptions::DuplicateOption::DuplicateOption
          (DuplicateOption *this,string *ctx,string *key)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  ContextError::ContextError(&this->super_ContextError,ctx,duplicate_option,key,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&(this->super_ContextError).super_Error = &PTR__ContextError_0012a9e8;
  return;
}

Assistant:

DuplicateOption(const std::string& ctx, const std::string& key) : ContextError(ctx, ContextError::duplicate_option, key) {}